

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall ncnn::Net::clear(Net *this)

{
  layer_destroyer_func p_Var1;
  long *plVar2;
  value_type pLVar3;
  ulong uVar4;
  int iVar5;
  size_type sVar6;
  reference ppLVar7;
  reference pvVar8;
  reference pvVar9;
  uint uVar10;
  long in_RDI;
  size_t i_1;
  size_t overwrite_builtin_layer_registry_entry_count;
  int index;
  int custom_index;
  int dret;
  Option opt1;
  Layer *layer;
  size_t i;
  layer_destroyer_func in_stack_ffffffffffffff58;
  value_type in_stack_ffffffffffffff60;
  size_type local_78;
  int local_64;
  undefined1 local_58 [64];
  value_type local_18;
  ulong local_10;
  
  std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::clear
            ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)0x1e54a9);
  local_10 = 0;
  do {
    uVar4 = local_10;
    sVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                       (*(long *)(in_RDI + 0x48) + 0x20));
    if (sVar6 <= uVar4) {
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::clear
                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x1e57aa);
      if (*(long *)(*(long *)(in_RDI + 0x48) + 200) != 0) {
        plVar2 = *(long **)(*(long *)(in_RDI + 0x48) + 200);
        if (plVar2 != (long *)0x0) {
          (**(code **)(*plVar2 + 8))();
        }
        *(undefined8 *)(*(long *)(in_RDI + 0x48) + 200) = 0;
      }
      if (*(long *)(*(long *)(in_RDI + 0x48) + 0xd0) != 0) {
        plVar2 = *(long **)(*(long *)(in_RDI + 0x48) + 0xd0);
        if (plVar2 != (long *)0x0) {
          (**(code **)(*plVar2 + 8))();
        }
        *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0xd0) = 0;
      }
      return;
    }
    ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                         (*(long *)(in_RDI + 0x48) + 0x20),local_10);
    local_18 = *ppLVar7;
    get_masked_option((Option *)in_stack_ffffffffffffff60,
                      (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    iVar5 = (*local_18->_vptr_Layer[5])(local_18,local_58);
    if (iVar5 != 0) {
      fprintf(_stderr,"layer destroy_pipeline failed");
      fprintf(_stderr,"\n");
    }
    if ((local_18->typeindex & 0x100U) == 0) {
      local_64 = -1;
      sVar6 = std::
              vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
              ::size((vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                      *)(*(long *)(in_RDI + 0x48) + 0xb0));
      for (local_78 = 0; local_78 < sVar6; local_78 = local_78 + 1) {
        pvVar9 = std::
                 vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                 ::operator[]((vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                               *)(*(long *)(in_RDI + 0x48) + 0xb0),local_78);
        if (pvVar9->typeindex == local_18->typeindex) {
          local_64 = (int)local_78;
          break;
        }
      }
      if ((local_64 == -1) ||
         (pvVar9 = std::
                   vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                   ::operator[]((vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                                 *)(*(long *)(in_RDI + 0x48) + 0xb0),(long)local_64),
         pvVar9->destroyer == (layer_destroyer_func)0x0)) {
        if (local_18 != (value_type)0x0) {
          (*local_18->_vptr_Layer[1])();
        }
      }
      else {
        pvVar9 = std::
                 vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                 ::operator[]((vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                               *)(*(long *)(in_RDI + 0x48) + 0xb0),(long)local_64);
        pLVar3 = local_18;
        in_stack_ffffffffffffff58 = pvVar9->destroyer;
        pvVar9 = std::
                 vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                 ::operator[]((vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                               *)(*(long *)(in_RDI + 0x48) + 0xb0),(long)local_64);
        (*in_stack_ffffffffffffff58)(pLVar3,pvVar9->userdata);
      }
    }
    else {
      uVar10 = local_18->typeindex & 0xfffffeff;
      pvVar8 = std::
               vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                             *)(*(long *)(in_RDI + 0x48) + 0x98),(long)(int)uVar10);
      if (pvVar8->destroyer == (layer_destroyer_func)0x0) {
        in_stack_ffffffffffffff60 = local_18;
        if (local_18 != (value_type)0x0) {
          (*local_18->_vptr_Layer[1])();
        }
      }
      else {
        pvVar8 = std::
                 vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                 ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                               *)(*(long *)(in_RDI + 0x48) + 0x98),(long)(int)uVar10);
        pLVar3 = local_18;
        p_Var1 = pvVar8->destroyer;
        pvVar8 = std::
                 vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                 ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                               *)(*(long *)(in_RDI + 0x48) + 0x98),(long)(int)uVar10);
        (*p_Var1)(pLVar3,pvVar8->userdata);
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

void Net::clear()
{
    d->blobs.clear();
    for (size_t i = 0; i < d->layers.size(); i++)
    {
        Layer* layer = d->layers[i];

        Option opt1 = get_masked_option(opt, layer->featmask);
#if NCNN_VULKAN
        if (!layer->support_image_storage)
        {
            opt1.use_image_storage = false;
        }
#endif // NCNN_VULKAN

        int dret = layer->destroy_pipeline(opt1);
        if (dret != 0)
        {
            NCNN_LOGE("layer destroy_pipeline failed");
            // ignore anyway
        }

        if (layer->typeindex & ncnn::LayerType::CustomBit)
        {
            int custom_index = layer->typeindex & ~ncnn::LayerType::CustomBit;
            if (d->custom_layer_registry[custom_index].destroyer)
            {
                d->custom_layer_registry[custom_index].destroyer(layer, d->custom_layer_registry[custom_index].userdata);
            }
            else
            {
                delete layer;
            }
        }
        else
        {
            // check overwrite builtin layer destroyer
            int index = -1;
            const size_t overwrite_builtin_layer_registry_entry_count = d->overwrite_builtin_layer_registry.size();
            for (size_t i = 0; i < overwrite_builtin_layer_registry_entry_count; i++)
            {
                if (d->overwrite_builtin_layer_registry[i].typeindex == layer->typeindex)
                {
                    index = i;
                    break;
                }
            }

            if (index != -1 && d->overwrite_builtin_layer_registry[index].destroyer)
            {
                d->overwrite_builtin_layer_registry[index].destroyer(layer, d->overwrite_builtin_layer_registry[index].userdata);
            }
            else
            {
                delete layer;
            }
        }
    }
    d->layers.clear();

    if (d->local_blob_allocator)
    {
        delete d->local_blob_allocator;
        d->local_blob_allocator = 0;
    }
    if (d->local_workspace_allocator)
    {
        delete d->local_workspace_allocator;
        d->local_workspace_allocator = 0;
    }

#if NCNN_VULKAN
    if (d->weight_vkallocator)
    {
        delete d->weight_vkallocator;
        d->weight_vkallocator = 0;
    }
    if (d->weight_staging_vkallocator)
    {
        delete d->weight_staging_vkallocator;
        d->weight_staging_vkallocator = 0;
    }
    if (d->pipeline_cache)
    {
        delete d->pipeline_cache;
        d->pipeline_cache = 0;
        opt.pipeline_cache = 0;
    }
#endif // NCNN_VULKAN
}